

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

void sftp_packetlist_flush(LIBSSH2_SFTP_HANDLE *handle)

{
  undefined4 uVar1;
  LIBSSH2_SFTP *sftp;
  LIBSSH2_SESSION *pLVar2;
  LIBSSH2_SESSION *session;
  int iVar3;
  list_node *node;
  list_node *plVar4;
  list_node *entry;
  uchar *data;
  size_t data_len;
  uchar *local_48;
  size_t local_40;
  list_head *local_38;
  
  sftp = handle->sftp;
  pLVar2 = sftp->channel->session;
  node = (list_node *)_libssh2_list_first(&handle->packet_list);
  if (node != (list_node *)0x0) {
    local_38 = &sftp->zombie_requests;
    do {
      plVar4 = (list_node *)_libssh2_list_next(node);
      iVar3 = sftp_packet_ask(sftp,'e',*(uint32_t *)&node[2].prev,&local_48,&local_40);
      if ((iVar3 == 0) ||
         (iVar3 = sftp_packet_ask(sftp,'g',*(uint32_t *)&node[2].prev,&local_48,&local_40),
         iVar3 == 0)) {
        (*pLVar2->free)(local_48,&pLVar2->abstract);
      }
      else if (node[1].head != (list_head *)0x0) {
        uVar1 = *(undefined4 *)&node[2].prev;
        session = sftp->channel->session;
        entry = (list_node *)(*session->alloc)(0x20,&session->abstract);
        if (entry == (list_node *)0x0) {
          _libssh2_error(session,-6,"malloc fail for zombie request  ID");
        }
        else {
          *(undefined4 *)&entry[1].next = uVar1;
          _libssh2_list_add(local_38,entry);
        }
      }
      _libssh2_list_remove(node);
      (*pLVar2->free)(node,&pLVar2->abstract);
      node = plVar4;
    } while (plVar4 != (list_node *)0x0);
  }
  return;
}

Assistant:

static void sftp_packetlist_flush(LIBSSH2_SFTP_HANDLE *handle)
{
    struct sftp_pipeline_chunk *chunk;
    LIBSSH2_SFTP *sftp = handle->sftp;
    LIBSSH2_SESSION *session = sftp->channel->session;

    /* remove pending packets, if any */
    chunk = _libssh2_list_first(&handle->packet_list);
    while(chunk) {
        unsigned char *data;
        size_t data_len;
        int rc;
        struct sftp_pipeline_chunk *next = _libssh2_list_next(&chunk->node);

        rc = sftp_packet_ask(sftp, SSH_FXP_STATUS,
                             chunk->request_id, &data, &data_len);
        if(rc)
            rc = sftp_packet_ask(sftp, SSH_FXP_DATA,
                                 chunk->request_id, &data, &data_len);

        if(!rc)
            /* we found a packet, free it */
            LIBSSH2_FREE(session, data);
        else if(chunk->sent)
            /* there was no incoming packet for this request, mark this
               request as a zombie if it ever sent the request */
            add_zombie_request(sftp, chunk->request_id);

        _libssh2_list_remove(&chunk->node);
        LIBSSH2_FREE(session, chunk);
        chunk = next;
    }
}